

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_cmp_fn_str_asc(void *a,void *b)

{
  int iVar1;
  sort_elem_str *elem_b;
  sort_elem_str *elem_a;
  
  iVar1 = strcmp(*a,*b);
  return iVar1;
}

Assistant:

static int kvtree_cmp_fn_str_asc(const void* a, const void* b)
{
  struct sort_elem_str* elem_a = (struct sort_elem_str*) a;
  struct sort_elem_str* elem_b = (struct sort_elem_str*) b;
  const char* str_a = elem_a->key;
  const char* str_b = elem_b->key;
  int cmp = strcmp(str_a, str_b);
  return cmp;
}